

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::MsgBoxButton::minimumSizeHint(MsgBoxButton *this)

{
  int iVar1;
  int iVar2;
  QSize QVar3;
  int iVar4;
  QRect QVar5;
  undefined1 local_60 [8];
  QRect local_58;
  QMargins local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  QWidget::fontMetrics((QWidget *)&local_58);
  iVar1 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_58);
  QWidget::fontMetrics((QWidget *)local_60);
  local_38 = 0;
  uStack_30 = 0xffffffffffffffff;
  local_58 = (QRect)QFontMetrics::boundingRect
                              ((QRect *)local_60,(int)&local_38,(QString *)0x84,(int)(this->d).d + 8
                               ,(int *)0x0);
  local_48.m_left = iVar1 / 3;
  local_48.m_top = local_48.m_left;
  local_48.m_right = local_48.m_left;
  local_48.m_bottom = local_48.m_left;
  QVar5 = QRect::marginsAdded(&local_58,&local_48);
  iVar4 = (QVar5.x2 - QVar5.x1) + 1;
  iVar1 = (QVar5.y2 - QVar5.y1) + 1;
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_60);
  iVar2 = FingerGeometry::width();
  if (iVar4 < iVar2) {
    iVar4 = iVar2;
  }
  iVar2 = FingerGeometry::height();
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  QVar3.ht = iVar2;
  QVar3.wd = iVar4;
  return QVar3;
}

Assistant:

QSize
MsgBoxButton::minimumSizeHint() const
{
	const int margin = fontMetrics().height() / 3;

	const QSize s = fontMetrics()
		.boundingRect( QRect(), Qt::AlignCenter, d->text )
		.marginsAdded( QMargins( margin, margin, margin, margin ) )
		.size();

	return QSize( qMax( s.width(), FingerGeometry::width() ),
		qMax( s.height(), FingerGeometry::height() ) );
}